

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void soplex::LPFwriteRows<double>
               (SPxLPBase<double> *p_lp,ostream *p_output,NameSet *p_rnames,NameSet *p_cnames)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *pdVar4;
  char *pcVar5;
  ostream *poVar6;
  NameSet *in_RCX;
  SPxLPBase<double> *in_RSI;
  SPxLPBase<double> *in_RDI;
  double rhs;
  double lhs;
  int i;
  char name [16];
  ostream *in_stack_ffffffffffffff18;
  SPxLPBase<double> *in_stack_ffffffffffffff20;
  SPxLPBase<double> *in_stack_ffffffffffffff28;
  NameSet *in_stack_ffffffffffffff30;
  NameSet *in_stack_ffffffffffffff38;
  SPxLPBase<double> *in_stack_ffffffffffffff40;
  SPxLPBase<double> *in_stack_ffffffffffffff48;
  int local_3c;
  
  std::operator<<((ostream *)in_RSI,"Subject To\n");
  local_3c = 0;
  do {
    iVar3 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x1b2ca1);
    if (iVar3 <= local_3c) {
      return;
    }
    pdVar4 = SPxLPBase<double>::lhs
                       (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    dVar1 = *pdVar4;
    pdVar4 = SPxLPBase<double>::rhs
                       (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    dVar2 = *pdVar4;
    pdVar4 = (double *)infinity();
    if ((dVar1 <= -*pdVar4) || (pdVar4 = (double *)infinity(), *pdVar4 <= dVar2)) {
LAB_001b2f4a:
      iVar3 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
      in_stack_ffffffffffffff18 = std::operator<<((ostream *)in_RSI," ");
      pcVar5 = LPFgetRowName<double>
                         (in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                          in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,iVar3);
      poVar6 = std::operator<<(in_stack_ffffffffffffff18,pcVar5);
      std::operator<<(poVar6," : ");
      in_stack_ffffffffffffff20 = in_RDI;
      in_stack_ffffffffffffff28 = in_RSI;
      in_stack_ffffffffffffff30 = in_RCX;
      SPxLPBase<double>::rowVector(in_RDI,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      LPFwriteRow<double>(in_stack_ffffffffffffff40,(ostream *)in_stack_ffffffffffffff38,
                          in_stack_ffffffffffffff30,(SVectorBase<double> *)in_stack_ffffffffffffff28
                          ,(double *)in_stack_ffffffffffffff20,(double *)in_stack_ffffffffffffff18);
    }
    else {
      if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) goto LAB_001b2f4a;
      in_stack_ffffffffffffff38 = (NameSet *)std::operator<<((ostream *)in_RSI," ");
      pcVar5 = LPFgetRowName<double>
                         (in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                          in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
                          (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      poVar6 = std::operator<<((ostream *)in_stack_ffffffffffffff38,pcVar5);
      std::operator<<(poVar6,"_1 : ");
      in_stack_ffffffffffffff40 = in_RDI;
      in_stack_ffffffffffffff48 = in_RSI;
      SPxLPBase<double>::rowVector
                (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      infinity();
      LPFwriteRow<double>(in_stack_ffffffffffffff40,(ostream *)in_stack_ffffffffffffff38,
                          in_stack_ffffffffffffff30,(SVectorBase<double> *)in_stack_ffffffffffffff28
                          ,(double *)in_stack_ffffffffffffff20,(double *)in_stack_ffffffffffffff18);
      poVar6 = std::operator<<((ostream *)in_RSI," ");
      pcVar5 = LPFgetRowName<double>
                         (in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                          in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30,
                          (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      poVar6 = std::operator<<(poVar6,pcVar5);
      std::operator<<(poVar6,"_2 : ");
      SPxLPBase<double>::rowVector
                (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      infinity();
      LPFwriteRow<double>(in_stack_ffffffffffffff40,(ostream *)in_stack_ffffffffffffff38,
                          in_stack_ffffffffffffff30,(SVectorBase<double> *)in_stack_ffffffffffffff28
                          ,(double *)in_stack_ffffffffffffff20,(double *)in_stack_ffffffffffffff18);
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

static void LPFwriteRows(
   const SPxLPBase<R>& p_lp,       ///< the LP
   std::ostream&          p_output,   ///< output stream
   const NameSet*         p_rnames,   ///< row names
   const NameSet*         p_cnames   ///< column names
)
{

   char name[16];

   p_output << "Subject To\n";

   for(int i = 0; i < p_lp.nRows(); ++i)
   {
      const R lhs = p_lp.lhs(i);
      const R rhs = p_lp.rhs(i);

      if(lhs > R(-infinity) && rhs < R(infinity) && lhs != rhs)
      {
         // ranged row -> write two non-ranged rows
         p_output << " " << LPFgetRowName(p_lp, i, p_rnames, name, i) << "_1 : ";
         LPFwriteRow(p_lp, p_output, p_cnames, p_lp.rowVector(i), lhs, R(infinity));

         p_output << " " << LPFgetRowName(p_lp, i, p_rnames, name, i) << "_2 : ";
         LPFwriteRow(p_lp, p_output, p_cnames, p_lp.rowVector(i), R(-infinity), rhs);
      }
      else
      {
         p_output << " " << LPFgetRowName(p_lp, i, p_rnames, name, i) << " : ";
         LPFwriteRow(p_lp, p_output, p_cnames, p_lp.rowVector(i), lhs, rhs);
      }
   }
}